

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.cpp
# Opt level: O2

void pstore::assert_failed(czstring str,czstring file,int line)

{
  int iVar1;
  ostream *poVar2;
  pointer *__ptr;
  __uniq_ptr_impl<char_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
  local_248;
  char *local_240 [2];
  undefined8 *local_230;
  char *local_228;
  array<void_*,_64UL> callstack;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"Assert failed: (");
  poVar2 = std::operator<<(poVar2,str);
  poVar2 = std::operator<<(poVar2,"), file ");
  poVar2 = std::operator<<(poVar2,file);
  poVar2 = std::operator<<(poVar2,", line ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,line);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = backtrace(&callstack,0x40);
  local_248._M_t.
  super__Tuple_impl<0UL,_char_**,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
  .super__Head_base<0UL,_char_**,_false>._M_head_impl =
       (tuple<char_**,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
        )backtrace_symbols(&callstack,iVar1);
  local_230 = &std::cerr;
  local_228 = "\n";
  std::copy<char**,std::ostream_iterator<char_const*,char,std::char_traits<char>>>
            (local_240,
             (char **)local_248._M_t.
                      super__Tuple_impl<0UL,_char_**,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                      .super__Head_base<0UL,_char_**,_false>._M_head_impl,
             (ostream_iterator<const_char_*,_char,_std::char_traits<char>_> *)
             ((long)local_248._M_t.
                    super__Tuple_impl<0UL,_char_**,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                    .super__Head_base<0UL,_char_**,_false>._M_head_impl + (long)iVar1 * 8));
  std::
  unique_ptr<char_*,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/support/assert.cpp:55:34)>
  ::~unique_ptr((unique_ptr<char_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_support_assert_cpp:55:34)>
                 *)&local_248);
  abort();
}

Assistant:

void assert_failed (gsl::czstring const str, gsl::czstring const file, int const line) {
#    ifdef _WIN32
        auto & out_stream = std::wcerr;
#    else
        auto & out_stream = std::cerr;
#    endif
        out_stream << PSTORE_NATIVE_TEXT ("Assert failed: (") << str
                   << PSTORE_NATIVE_TEXT ("), file ") << file << PSTORE_NATIVE_TEXT (", line ")
                   << line << std::endl;
#    if PSTORE_HAVE_BACKTRACE
        {
            std::array<void *, 64U> callstack;
            void ** const out = callstack.data ();
            int const frames = ::backtrace (out, static_cast<int> (callstack.size ()));

            auto const deleter = [] (void * const p) {
                if (p != nullptr) {
                    // NOLINTNEXTLINE(cppcoreguidelines-no-malloc, hicpp-no-malloc)
                    std::free (p);
                }
            };
            std::unique_ptr<gsl::zstring, decltype (deleter)> const strs{
                ::backtrace_symbols (out, frames), deleter};
            auto * const begin = strs.get ();
            std::copy (
                begin, begin + frames,
                std::ostream_iterator<gsl::czstring> (out_stream, PSTORE_NATIVE_TEXT ("\n")));
        }
#    endif // PSTORE_HAVE_BACKTRACE
        std::abort ();
    }